

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigConstr.c
# Opt level: O2

void Saig_ManFoldConstrTest(Aig_Man_t *pAig)

{
  uint uVar1;
  Aig_Man_t *pAig_00;
  Vec_Int_t *vConstrs;
  int *__ptr;
  ulong uVar2;
  Aig_Man_t *pMan;
  uint uVar3;
  long lVar4;
  ulong uVar5;
  
  pAig_00 = Saig_ManDupUnfoldConstrs(pAig);
  uVar1 = pAig_00->nTruePos;
  vConstrs = (Vec_Int_t *)malloc(0x10);
  uVar3 = 0x10;
  if (0xe < uVar1 - 1) {
    uVar3 = uVar1;
  }
  vConstrs->nCap = uVar3;
  uVar5 = 0;
  if (uVar3 == 0) {
    __ptr = (int *)0x0;
  }
  else {
    __ptr = (int *)malloc((long)(int)uVar3 << 2);
  }
  vConstrs->pArray = __ptr;
  vConstrs->nSize = uVar1;
  uVar2 = 0;
  if (0 < (int)uVar1) {
    uVar2 = (ulong)uVar1;
  }
  for (; uVar2 != uVar5; uVar5 = uVar5 + 1) {
    __ptr[uVar5] = (int)uVar5;
  }
  for (lVar4 = 1; lVar4 - uVar2 != 1; lVar4 = lVar4 + 1) {
    if (__ptr[lVar4 + -1] == 0) goto LAB_0058cbe2;
  }
  if ((int)uVar1 < 0) {
    __assert_fail("i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,999,"int Vec_IntRemove(Vec_Int_t *, int)");
  }
LAB_0058cbf2:
  pMan = Saig_ManDupFoldConstrs(pAig_00,vConstrs);
  free(__ptr);
  free(vConstrs);
  Ioa_WriteAiger(pMan,"test.aig",0,0);
  Aig_ManStop(pAig_00);
  Aig_ManStop(pMan);
  return;
LAB_0058cbe2:
  for (; (int)lVar4 < (int)uVar1; lVar4 = lVar4 + 1) {
    __ptr[lVar4 + -1] = __ptr[lVar4];
  }
  vConstrs->nSize = uVar1 - 1;
  goto LAB_0058cbf2;
}

Assistant:

void Saig_ManFoldConstrTest( Aig_Man_t * pAig )
{
    Aig_Man_t * pAig1, * pAig2;
    Vec_Int_t * vConstrs;
    // unfold constraints
    pAig1 = Saig_ManDupUnfoldConstrs( pAig );
    // create the constraint list
    vConstrs = Vec_IntStartNatural( Saig_ManPoNum(pAig1) );
    Vec_IntRemove( vConstrs, 0 );
    // fold constraints back
    pAig2 = Saig_ManDupFoldConstrs( pAig1, vConstrs );
    Vec_IntFree( vConstrs );
    // compare the two AIGs
    Ioa_WriteAiger( pAig2, "test.aig", 0, 0 );
    Aig_ManStop( pAig1 );
    Aig_ManStop( pAig2 );
}